

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O0

size_t __thiscall
std::hash<PackedVertexPNTCUV>::operator()(hash<PackedVertexPNTCUV> *this,PackedVertexPNTCUV *v)

{
  size_t h;
  size_t *__end2;
  size_t *__begin2;
  size_t (*__range2) [15];
  size_t seed;
  hash<float> local_a0;
  hash<float> local_9f;
  hash<float> local_9e;
  hash<float> local_9d;
  hash<float> local_9c;
  hash<float> local_9b;
  hash<float> local_9a;
  hash<float> local_99;
  size_t local_98;
  size_t hashes [15];
  PackedVertexPNTCUV *v_local;
  hash<PackedVertexPNTCUV> *this_local;
  
  local_98 = hash<float>::operator()(&local_99,(v->position).field_0.field_0.x);
  hashes[0] = hash<float>::operator()(&local_9a,(v->position).field_0.field_0.y);
  hashes[1] = hash<float>::operator()(&local_9b,(v->position).field_0.field_0.z);
  hashes[2] = hash<float>::operator()(&local_9c,(v->normal).field_0.field_0.x);
  hashes[3] = hash<float>::operator()(&local_9d,(v->normal).field_0.field_0.y);
  hashes[4] = hash<float>::operator()(&local_9e,(v->normal).field_0.field_0.z);
  hashes[5] = hash<float>::operator()(&local_9f,(v->tangent).field_0.field_0.x);
  hashes[6] = hash<float>::operator()(&local_a0,(v->tangent).field_0.field_0.y);
  hashes[7] = hash<float>::operator()
                        ((hash<float> *)((long)&seed + 7),(v->tangent).field_0.field_0.z);
  hashes[8] = hash<float>::operator()((hash<float> *)((long)&seed + 6),(v->color).field_0.field_0.x)
  ;
  hashes[9] = hash<float>::operator()((hash<float> *)((long)&seed + 5),(v->color).field_0.field_0.y)
  ;
  hashes[10] = hash<float>::operator()
                         ((hash<float> *)((long)&seed + 4),(v->color).field_0.field_0.z);
  hashes[0xb] = hash<float>::operator()
                          ((hash<float> *)((long)&seed + 3),(v->color).field_0.field_0.w);
  hashes[0xc] = hash<float>::operator()((hash<float> *)((long)&seed + 2),(v->uv).field_0.field_0.x);
  hash<float>::operator()((hash<float> *)((long)&seed + 1),(v->uv).field_0.field_0.y);
  __range2 = (size_t (*) [15])0x0;
  for (__end2 = &local_98; __end2 != hashes + 0xe; __end2 = __end2 + 1) {
    __range2 = (size_t (*) [15])
               (*__end2 + 0x9e3779b9 + (long)__range2 * 0x40 + ((ulong)__range2 >> 2) ^
               (ulong)__range2);
  }
  return (size_t)__range2;
}

Assistant:

std::size_t operator()(const PackedVertexPNTCUV & v) const
  {
    std::size_t hashes[] = {std::hash<float>()(v.position.x), std::hash<float>()(v.position.y), std::hash<float>()(v.position.z), std::hash<float>()(v.normal.x),  std::hash<float>()(v.normal.y),
                            std::hash<float>()(v.normal.z),   std::hash<float>()(v.tangent.x),  std::hash<float>()(v.tangent.y),  std::hash<float>()(v.tangent.z), std::hash<float>()(v.color.x),
                            std::hash<float>()(v.color.y),    std::hash<float>()(v.color.z),    std::hash<float>()(v.color.w),    std::hash<float>()(v.uv.x),      std::hash<float>()(v.uv.y)};
    std::size_t seed = 0;
    for (std::size_t h : hashes) {
      // from boost::hash_combine
      seed ^= h + 0x9e3779b9 + (seed << 6) + (seed >> 2);
    }
    return seed;
  }